

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall google::protobuf::FieldDescriptor::has_optional_keyword(FieldDescriptor *this)

{
  bool bVar1;
  Edition EVar2;
  FileDescriptor *this_00;
  OneofDescriptor *pOVar3;
  byte local_21;
  byte local_11;
  FieldDescriptor *this_local;
  
  local_11 = 1;
  if (((byte)this->field_0x1 >> 1 & 1) == 0) {
    this_00 = file(this);
    EVar2 = FileDescriptor::edition(this_00);
    local_21 = 0;
    if (EVar2 == EDITION_PROTO2) {
      bVar1 = is_required(this);
      local_21 = 0;
      if (!bVar1) {
        bVar1 = is_repeated(this);
        local_21 = 0;
        if (!bVar1) {
          pOVar3 = containing_oneof(this);
          local_21 = pOVar3 != (OneofDescriptor *)0x0 ^ 0xff;
        }
      }
    }
    local_11 = local_21;
  }
  return (bool)(local_11 & 1);
}

Assistant:

bool FieldDescriptor::has_optional_keyword() const {
  return proto3_optional_ ||
         (file()->edition() == Edition::EDITION_PROTO2 && !is_required() &&
          !is_repeated() && !containing_oneof());
}